

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O1

void __thiscall kj::parse::anon_unknown_0::TestCase394::run(TestCase394 *this)

{
  return;
}

Assistant:

TEST(CommonParsers, TransformParser) {
  StringPtr text = "foo";

  auto parser = transformWithLocation(
      sequence(exactly('f'), exactly('o'), exactly('o')),
      [](Span<const char*> location) -> int {
        EXPECT_EQ("foo", StringPtr(location.begin(), location.end()));
        return 123;
      });

  {
    Input input(text.begin(), text.end());
    Maybe<int> result = parser(input);
    KJ_IF_MAYBE(i, result) {
      EXPECT_EQ(123, *i);
    } else {
      ADD_FAILURE() << "Expected 123, got null.";
    }
    EXPECT_TRUE(input.atEnd());
  }